

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::internal::FormatEpochTimeInMillisAsIso8601_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  tm *ptVar1;
  int value;
  int value_00;
  int value_01;
  int value_02;
  int value_03;
  string local_210;
  long local_1f0;
  time_t seconds;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_24;
  
  local_1f0 = (long)this / 1000;
  ptVar1 = localtime(&local_1f0);
  if (ptVar1 == (tm *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_48);
  }
  else {
    local_24 = ptVar1->tm_year + 0x76c;
    StreamableToString<int>(&local_210,&local_24);
    std::operator+(&local_108,&local_210,"-");
    String::FormatIntWidth2_abi_cxx11_(&local_e8,(String *)(ulong)(ptVar1->tm_mon + 1),value);
    std::operator+(&local_128,&local_108,&local_e8);
    std::operator+(&local_148,&local_128,"-");
    String::FormatIntWidth2_abi_cxx11_(&local_c8,(String *)(ulong)(uint)ptVar1->tm_mday,value_00);
    std::operator+(&local_168,&local_148,&local_c8);
    std::operator+(&local_188,&local_168,"T");
    String::FormatIntWidth2_abi_cxx11_(&local_a8,(String *)(ulong)(uint)ptVar1->tm_hour,value_01);
    std::operator+(&local_1a8,&local_188,&local_a8);
    std::operator+(&local_1c8,&local_1a8,":");
    String::FormatIntWidth2_abi_cxx11_(&local_88,(String *)(ulong)(uint)ptVar1->tm_min,value_02);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&seconds,
                   &local_1c8,&local_88);
    std::operator+(&local_48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&seconds,":"
                  );
    String::FormatIntWidth2_abi_cxx11_(&local_68,(String *)(ulong)(uint)ptVar1->tm_sec,value_03);
    std::operator+(__return_storage_ptr__,&local_48,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&seconds);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_210);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormatEpochTimeInMillisAsIso8601(TimeInMillis ms) {
  // Using non-reentrant version as localtime_r is not portable.
  time_t seconds = static_cast<time_t>(ms / 1000);
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4996)  // Temporarily disables warning 4996
                                // (function or variable may be unsafe).
  const struct tm* const time_struct = localtime(&seconds);  // NOLINT
# pragma warning(pop)           // Restores the warning state again.
#else
  const struct tm* const time_struct = localtime(&seconds);  // NOLINT
#endif
  if (time_struct == NULL)
    return "";  // Invalid ms value

  // YYYY-MM-DDThh:mm:ss
  return StreamableToString(time_struct->tm_year + 1900) + "-" +
      String::FormatIntWidth2(time_struct->tm_mon + 1) + "-" +
      String::FormatIntWidth2(time_struct->tm_mday) + "T" +
      String::FormatIntWidth2(time_struct->tm_hour) + ":" +
      String::FormatIntWidth2(time_struct->tm_min) + ":" +
      String::FormatIntWidth2(time_struct->tm_sec);
}